

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_log10>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  unary_op_log10 *this;
  long *in_RDI;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128 afVar8;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log10 op;
  Mat *m;
  __m256 *in_stack_fffffffffffffde0;
  float local_1f0 [2];
  float afStack_1e8 [2];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  int local_1bc;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  long local_198;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined8 local_178;
  unary_op_log10 *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  unary_op_log10 local_149 [9];
  long *local_140;
  undefined1 local_135;
  int local_134;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_110;
  unary_op_log10 *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  unary_op_log10 *local_d0;
  unary_op_log10 *local_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  unary_op_log10 *local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  unary_op_log10 *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined8 *local_58;
  
  local_150 = *(int *)((long)in_RDI + 0x2c);
  local_154 = (int)in_RDI[6];
  local_158 = *(int *)((long)in_RDI + 0x34);
  local_15c = (int)in_RDI[7];
  local_160 = (int)in_RDI[3];
  local_164 = local_150 * local_154 * local_158 * local_160;
  local_140 = in_RDI;
  for (local_168 = 0; local_168 < local_15c; local_168 = local_168 + 1) {
    local_128 = &local_1b8;
    local_7c = *(int *)((long)local_140 + 0x2c);
    local_80 = (int)local_140[6];
    local_84 = *(undefined4 *)((long)local_140 + 0x34);
    this = (unary_op_log10 *)(*local_140 + local_140[8] * (long)local_168 * local_140[2]);
    local_98 = local_140[2];
    local_9c = (undefined4)local_140[3];
    local_a8 = local_140[4];
    local_78 = &local_1b8;
    local_68 = (long)local_7c * (long)local_80 * local_98;
    local_120 = &local_1b8;
    local_110 = &local_1b8;
    local_6c = 0x10;
    local_134 = local_168;
    local_135 = 1;
    local_1b8 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    local_190 = 0;
    local_18c = 0;
    local_188 = 0;
    local_184 = 0;
    local_180 = 0;
    local_178 = 0;
    local_1b0 = 0;
    local_170 = this;
    local_90 = this;
    local_58 = local_110;
    local_198 = local_a8;
    for (local_1bc = 0; local_1bc + 7 < local_164; local_1bc = local_1bc + 8) {
      local_108 = local_170;
      uVar5 = *(undefined8 *)local_170;
      uVar4 = *(undefined8 *)(local_170 + 8);
      uVar6 = *(undefined8 *)(local_170 + 0x10);
      uVar7 = *(undefined8 *)(local_170 + 0x18);
      local_1e0 = uVar5;
      uStack_1d8 = uVar4;
      uStack_1d0 = uVar6;
      uStack_1c8 = uVar7;
      UnaryOp_x86_fma_functor::unary_op_log10::func_pack8(this,in_stack_fffffffffffffde0);
      local_d0 = local_170;
      auVar1._8_8_ = uVar4;
      auVar1._0_8_ = uVar5;
      auVar1._16_8_ = uVar6;
      auVar1._24_8_ = uVar7;
      *(undefined1 (*) [32])local_170 = auVar1;
      local_170 = local_170 + 0x20;
      local_1e0 = uVar5;
      uStack_1d8 = uVar4;
      uStack_1d0 = uVar6;
      uStack_1c8 = uVar7;
      local_100 = uVar5;
      uStack_f8 = uVar4;
      uStack_f0 = uVar6;
      uStack_e8 = uVar7;
    }
    for (; local_1bc + 3 < local_164; local_1bc = local_1bc + 4) {
      local_c8 = local_170;
      local_1f0 = *(float (*) [2])local_170;
      uVar5 = *(undefined8 *)(local_170 + 8);
      afStack_1e8 = (float  [2])uVar5;
      afVar8 = UnaryOp_x86_fma_functor::unary_op_log10::func_pack4(local_149,(__m128 *)local_1f0);
      local_1f0 = afVar8._0_8_;
      local_b0 = local_170;
      auVar2._8_4_ = (float)uVar5;
      auVar2._12_4_ = SUB84(uVar5,4);
      auVar2._0_4_ = local_1f0[0];
      auVar2._4_4_ = local_1f0[1];
      *(undefined1 (*) [16])local_170 = auVar2;
      local_170 = local_170 + 0x10;
      afStack_1e8 = (float  [2])uVar5;
      local_c0 = local_1f0;
      afStack_b8 = (float  [2])uVar5;
    }
    for (; local_1bc < local_164; local_1bc = local_1bc + 1) {
      fVar3 = UnaryOp_x86_fma_functor::unary_op_log10::func(this,*in_stack_fffffffffffffde0);
      *(float *)local_170 = fVar3;
      local_170 = local_170 + 4;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}